

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_bar.cpp
# Opt level: O3

void __thiscall BmsBarManager::SetResolution(BmsBarManager *this,double d)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  double dVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  
  this->barresolution_ = (uint)(long)((double)this->barresolution_ * d);
  auVar2 = _DAT_00137010;
  lVar3 = 0;
  dVar4 = (double)DAT_00137010;
  dVar5 = DAT_00137010._8_8_;
  do {
    auVar1 = *(undefined1 (*) [16])(this->barcount_ + lVar3);
    auVar10._4_4_ = 0;
    auVar10._0_4_ = auVar1._8_4_;
    auVar10._8_4_ = auVar1._12_4_;
    auVar10._12_4_ = 0;
    auVar10 = auVar10 | auVar2;
    auVar7._0_8_ = auVar1._0_8_ & 0xffffffff;
    auVar7._8_4_ = auVar1._4_4_;
    auVar7._12_4_ = 0;
    auVar7 = auVar7 | auVar2;
    dVar6 = (auVar7._0_8_ - dVar4) * d;
    dVar8 = (auVar7._8_8_ - dVar5) * d;
    dVar9 = (auVar10._0_8_ - dVar4) * d;
    dVar11 = (auVar10._8_8_ - dVar5) * d;
    iVar12 = (int)dVar9;
    iVar13 = (int)dVar11;
    iVar14 = (int)dVar6;
    iVar15 = (int)dVar8;
    *(ulong *)(this->barcount_ + lVar3) =
         CONCAT44((int)(dVar8 - 2147483648.0),(int)(dVar6 - 2147483648.0)) &
         CONCAT44(iVar15 >> 0x1f,iVar14 >> 0x1f) | CONCAT44(iVar15,iVar14);
    *(ulong *)(this->barcount_ + lVar3 + 2) =
         CONCAT44((int)(dVar11 - 2147483648.0),(int)(dVar9 - 2147483648.0)) &
         CONCAT44(iVar13 >> 0x1f,iVar12 >> 0x1f) | CONCAT44(iVar13,iVar12);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 1000);
  InvalidateCache(this);
  return;
}

Assistant:

void
BmsBarManager::SetResolution(double d)
{
	barresolution_ *= d;

	// make every cache size reseted and InvalidateCache
	for (int i = 0; i < BmsConst::BAR_MAX_COUNT; i++)
		barcount_[i] *= d;

	// invalidate cache
	InvalidateCache();
}